

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Builder __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Data>
          (PointerBuilder *this,void *defaultValue,ByteCount defaultSize)

{
  CapTableBuilder *capTable;
  word *pwVar1;
  BuilderArena *this_00;
  undefined1 uVar2;
  uint uVar3;
  SegmentBuilder *this_01;
  ulong uVar4;
  WirePointer *pWVar5;
  uint uVar6;
  word *result;
  WirePointer *__dest;
  WirePointer *ref;
  AllocateResult AVar7;
  Builder BVar8;
  ThrowOverflow local_61;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  ref = this->pointer;
  this_01 = this->segment;
  capTable = this->capTable;
  uVar3 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_61);
  uVar6 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef != (StructRef)0x0 || uVar6 != 0) {
    if ((uVar6 & 3) == 2) {
      this_01 = BuilderArena::getSegment
                          ((BuilderArena *)(this_01->super_SegmentReader).arena,
                           (SegmentId)(ref->field_1).structRef);
      uVar6 = (ref->offsetAndKind).value;
      pwVar1 = (this_01->super_SegmentReader).ptr.ptr;
      uVar4 = (ulong)(uVar6 & 0xfffffff8);
      pWVar5 = (WirePointer *)((long)&pwVar1->content + uVar4);
      ref = (WirePointer *)((long)&pwVar1[1].content + uVar4);
      if ((uVar6 & 4) == 0) {
        __dest = ref + ((int)(pWVar5->offsetAndKind).value >> 2);
        ref = pWVar5;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)(pWVar5->field_1).structRef);
        __dest = (WirePointer *)
                 ((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar5->offsetAndKind).value & 0xfffffff8));
      }
    }
    else {
      __dest = ref + (long)((int)uVar6 >> 2) + 1;
    }
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    _kjCondition.left = (ref->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.result) {
      uVar2 = (undefined1)(ref->field_1).upper32Bits;
      _kjCondition.left = CONCAT22(0,(undefined2)CONCAT11(2,(undefined1)(uVar2 & 7)));
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = (uVar2 & 7) == FAR;
      if (_kjCondition.result) {
        uVar4 = (ulong)((ref->field_1).upper32Bits >> 3);
        goto LAB_00119cd5;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[94]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6de,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                 "_kjCondition,\"Schema mismatch: Called getData{Field,Element}() but existing list pointer is not \" \"byte-sized.\""
                 ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                 (char (*) [94])
                 "Schema mismatch: Called getData{Field,Element}() but existing list pointer is not byte-sized."
                );
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6d9,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getData{Field,Element}() but existing pointer is not a list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getData{Field,Element}() but existing pointer is not a list."
                );
    }
    kj::_::Debug::Fault::~Fault(&f);
  }
  if (uVar3 == 0) {
    uVar4 = 0;
    __dest = (WirePointer *)0x0;
  }
  else {
    uVar6 = uVar3 + 7 >> 3;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this_01,capTable,ref);
    }
    __dest = (WirePointer *)this_01->pos;
    if (((long)((long)(this_01->super_SegmentReader).ptr.ptr +
               ((this_01->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
         (long)(ulong)uVar6) ||
       (this_01->pos = (word *)(__dest + uVar6), __dest == (WirePointer *)0x0)) {
      this_00 = (BuilderArena *)(this_01->super_SegmentReader).arena;
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar6 + 1,(anon_class_1_0_00000001 *)&_kjCondition);
      AVar7 = BuilderArena::allocate(this_00,uVar6);
      pWVar5 = (WirePointer *)AVar7.words;
      (ref->offsetAndKind).value =
           (int)AVar7.words - *(int *)&((AVar7.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar7.segment)->super_SegmentReader).id.value;
      (pWVar5->offsetAndKind).value = 1;
      __dest = pWVar5 + 1;
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)__dest - (long)ref) >> 1) & 0xfffffffc) - 3
      ;
      pWVar5 = ref;
    }
    (pWVar5->field_1).upper32Bits = uVar3 * 8 + 2;
    uVar4 = (ulong)uVar3;
    memcpy(__dest,defaultValue,uVar4);
  }
LAB_00119cd5:
  BVar8.super_ArrayPtr<unsigned_char>.size_ = uVar4;
  BVar8.super_ArrayPtr<unsigned_char>.ptr = (uchar *)__dest;
  return (Builder)BVar8.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder PointerBuilder::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableDataPointer(pointer, segment, capTable, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}